

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.cpp
# Opt level: O1

bool __thiscall helics::GlobalTimeCoordinator::updateTimeFactors(GlobalTimeCoordinator *this)

{
  TimeDependencies *dependencies;
  int32_t *piVar1;
  GlobalFederateId sourceId;
  pointer pDVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  DependencyInfo *dep;
  pointer pDVar8;
  Time TVar9;
  const_iterator __begin1;
  const_iterator __end1;
  TimeDependencies *__range1;
  TimeData timeStream;
  ActionMessage updateTime;
  TimeData local_130;
  ActionMessage local_e8;
  
  dependencies = &(this->super_BaseTimeCoordinator).dependencies;
  generateMinTimeUpstream
            (&local_130,dependencies,true,
             (GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
             (GlobalFederateId)0x8831d580,0);
  if (local_130.mTimeState == time_granted) {
    this->currentTimeState = time_granted;
    (this->currentMinTime).internalTimeCode = local_130.next.internalTimeCode;
    (this->nextEvent).internalTimeCode = local_130.next.internalTimeCode;
  }
  else if (local_130.mTimeState == time_requested) {
    if (this->currentTimeState == time_requested) {
      lVar7 = (this->nextEvent).internalTimeCode;
      TVar9.internalTimeCode = lVar7 + 1;
      if (lVar7 == 0x7fffffffffffffff) {
        TVar9.internalTimeCode = 0x7fffffffffffffff;
      }
      bVar4 = TimeDependencies::verifySequenceCounter
                        (dependencies,TVar9,(this->super_BaseTimeCoordinator).sequenceCounter);
      pDVar8 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pDVar2 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (!bVar4) {
        for (; pDVar8 != pDVar2; pDVar8 = pDVar8 + 1) {
          if (((((pDVar8->updateRequested == false) &&
                (lVar7 = (pDVar8->super_TimeData).next.internalTimeCode,
                lVar7 != 0x7fffffffffffffff && lVar7 <= TVar9.internalTimeCode)) &&
               (pDVar8->dependency == true)) &&
              ((pDVar8->dependent == true && ('\0' < (pDVar8->super_TimeData).timingVersion)))) &&
             ((lVar7 != 0x7fffffffffffffff && lVar7 <= TVar9.internalTimeCode &&
              ((pDVar8->super_TimeData).responseSequenceCounter !=
               (this->super_BaseTimeCoordinator).sequenceCounter)))) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"sequence check but no request",0x1d);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
            std::ostream::put(-8);
            std::ostream::flush();
          }
        }
        goto LAB_00355552;
      }
      bVar5 = false;
      bVar4 = false;
      if (pDVar8 == pDVar2) {
        lVar7 = 0x7fffffffffffffff;
      }
      else {
        lVar7 = 0x7fffffffffffffff;
        do {
          if ((TVar9.internalTimeCode < (pDVar8->super_TimeData).next.internalTimeCode) ||
             (pDVar8->nonGranting != true)) {
            lVar3 = (pDVar8->super_TimeData).Te.internalTimeCode;
            if (lVar3 < lVar7) {
              lVar7 = lVar3;
            }
          }
          else {
            bVar4 = bVar5;
            if (pDVar8->triggered != false) {
              bVar4 = true;
              bVar5 = bVar4;
            }
          }
          pDVar8 = pDVar8 + 1;
        } while (pDVar8 != pDVar2);
      }
      TVar9.internalTimeCode = lVar7 + 1;
      if (lVar7 == 0x7fffffffffffffff) {
        TVar9.internalTimeCode = 0x7fffffffffffffff;
      }
      lVar3 = (this->nextEvent).internalTimeCode;
      bVar5 = lVar7 <= lVar3;
      (this->nextEvent).internalTimeCode = lVar7;
      if (lVar3 < lVar7) {
        bVar5 = TimeDependencies::verifySequenceCounter
                          (dependencies,TVar9,(this->super_BaseTimeCoordinator).sequenceCounter);
      }
      if ((!bVar4 && (~bVar5 & 1U) == 0) && (this->mNewRequest != true)) {
        sourceId.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
        ActionMessage::ActionMessage(&local_e8,cmd_time_request,sourceId,sourceId);
        iVar6 = (this->super_BaseTimeCoordinator).sequenceCounter + 1;
        (this->super_BaseTimeCoordinator).sequenceCounter = iVar6;
        local_e8.counter = (uint16_t)iVar6;
        pDVar8 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pDVar2 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_e8.actionTime.internalTimeCode = TVar9.internalTimeCode;
        local_e8.Te.internalTimeCode = TVar9.internalTimeCode;
        local_e8.Tdemin.internalTimeCode = TVar9.internalTimeCode;
        if (pDVar8 != pDVar2) {
          do {
            lVar7 = (pDVar8->super_TimeData).next.internalTimeCode;
            if (lVar7 != 0x7fffffffffffffff && lVar7 <= TVar9.internalTimeCode) {
              local_e8.dest_id.gid = (pDVar8->fedID).gid;
              local_e8.source_handle.hid = (pDVar8->super_TimeData).sequenceCounter;
              if ((this->super_BaseTimeCoordinator).sendMessageFunction.super__Function_base.
                  _M_manager == (_Manager_type)0x0) {
                std::__throw_bad_function_call();
              }
              (*(this->super_BaseTimeCoordinator).sendMessageFunction._M_invoker)
                        ((_Any_data *)&(this->super_BaseTimeCoordinator).sendMessageFunction,
                         &local_e8);
            }
            pDVar8 = pDVar8 + 1;
          } while (pDVar8 != pDVar2);
        }
        this->currentTimeState = time_granted;
        (this->currentMinTime).internalTimeCode = local_130.Te.internalTimeCode;
        (this->nextEvent).internalTimeCode = local_130.Te.internalTimeCode;
        ActionMessage::~ActionMessage(&local_e8);
        goto LAB_00355552;
      }
      piVar1 = &(this->super_BaseTimeCoordinator).sequenceCounter;
      *piVar1 = *piVar1 + 1;
      this->mNewRequest = false;
    }
    else {
      if (this->currentTimeState != time_granted) goto LAB_00355552;
      this->currentTimeState = time_requested;
      (this->currentMinTime).internalTimeCode = local_130.next.internalTimeCode;
      pDVar8 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pDVar2 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar7 = 0x7fffffffffffffff;
      if (pDVar8 != pDVar2) {
        lVar7 = 0x7fffffffffffffff;
        do {
          if ((pDVar8->nonGranting == false) &&
             (lVar3 = (pDVar8->super_TimeData).Te.internalTimeCode, lVar3 < lVar7)) {
            lVar7 = lVar3;
          }
          pDVar8 = pDVar8 + 1;
        } while (pDVar8 != pDVar2);
      }
      (this->nextEvent).internalTimeCode = lVar7;
      piVar1 = &(this->super_BaseTimeCoordinator).sequenceCounter;
      *piVar1 = *piVar1 + 1;
      TVar9.internalTimeCode = lVar7 + 1;
      if (lVar7 == 0x7fffffffffffffff) {
        TVar9.internalTimeCode = 0x7fffffffffffffff;
      }
      this->mNewRequest = false;
    }
    sendTimeUpdateRequest(this,TVar9);
  }
LAB_00355552:
  return local_130.mTimeState != time_granted;
}

Assistant:

bool GlobalTimeCoordinator::updateTimeFactors()
{
    auto timeStream = generateMinTimeUpstream(dependencies, true, mSourceId, NoIgnoredFederates, 0);
    if (timeStream.mTimeState == TimeState::time_granted) {
        currentTimeState = TimeState::time_granted;
        currentMinTime = timeStream.next;
        nextEvent = timeStream.next;
        return false;
    }
    if (timeStream.mTimeState == TimeState::time_requested) {
        if (currentTimeState == TimeState::time_granted) {
            currentTimeState = TimeState::time_requested;
            currentMinTime = timeStream.next;
            nextEvent = findNextTriggerEvent(dependencies);
            ++sequenceCounter;
            auto trigTime = (nextEvent < cBigTime) ? nextEvent + Time::epsilon() : nextEvent;
            mNewRequest = false;
            sendTimeUpdateRequest(trigTime);
            return true;
        }
        if (currentTimeState == TimeState::time_requested) {
            auto trigTime = (nextEvent < cBigTime) ? nextEvent + Time::epsilon() : nextEvent;
            if (dependencies.verifySequenceCounter(trigTime, sequenceCounter)) {
                auto trig = checkForTriggered(dependencies, trigTime);
                bool verified{trig.second <= nextEvent};
                nextEvent = trig.second;
                trigTime = (nextEvent < cBigTime) ? nextEvent + Time::epsilon() : nextEvent;
                if (!verified) {
                    verified = dependencies.verifySequenceCounter(trigTime, sequenceCounter);
                }

                if (trig.first || !verified || mNewRequest) {
                    ++sequenceCounter;
                    mNewRequest = false;
                    sendTimeUpdateRequest(trigTime);
                    return true;
                }
                ActionMessage updateTime(CMD_TIME_REQUEST, mSourceId, mSourceId);
                updateTime.actionTime = trigTime;
                updateTime.Te = trigTime;
                updateTime.Tdemin = trigTime;

                ++sequenceCounter;
                updateTime.counter = sequenceCounter;
                for (const auto& dep : dependencies) {
                    if (dep.next <= trigTime && dep.next < cBigTime) {
                        updateTime.dest_id = dep.fedID;
                        updateTime.setExtraDestData(dep.sequenceCounter);
                        sendMessageFunction(updateTime);
                    }
                }
                currentTimeState = TimeState::time_granted;
                currentMinTime = timeStream.Te;
                nextEvent = timeStream.Te;
            } else {
                for (auto& dep : dependencies) {
                    if (dep.updateRequested) {
                        continue;
                    }
                    if (dep.next <= trigTime && dep.next < cBigTime) {
                        if (!checkSequenceCounter(dep, trigTime, sequenceCounter)) {
                            std::cerr << "sequence check but no request" << std::endl;
                            /* ActionMessage updateTime(CMD_REQUEST_CURRENT_TIME,
                                                       mSourceId,
                                                       mSourceId);
                              updateTime.counter = sequenceCounter;

                              updateTime.dest_id = dep.fedID;
                              updateTime.setExtraDestData(dep.sequenceCounter);
                              dep.updateRequested = true;
                              sendMessageFunction(updateTime);
                              */
                        }
                    }
                }
            }
        }
    }
    return true;
}